

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImWchar FindFirstExistingGlyph(ImFont *font,ImWchar *candidate_chars,int candidate_chars_count)

{
  ImWchar c;
  ImFontGlyph *pIVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)candidate_chars_count;
  if (candidate_chars_count < 1) {
    uVar2 = uVar3;
  }
  do {
    if (uVar2 == uVar3) {
      return 0xffff;
    }
    c = candidate_chars[uVar3];
    pIVar1 = ImFont::FindGlyphNoFallback(font,c);
    uVar3 = uVar3 + 1;
  } while (pIVar1 == (ImFontGlyph *)0x0);
  return c;
}

Assistant:

static ImWchar FindFirstExistingGlyph(ImFont* font, const ImWchar* candidate_chars, int candidate_chars_count)
{
    for (int n = 0; n < candidate_chars_count; n++)
        if (font->FindGlyphNoFallback(candidate_chars[n]) != NULL)
            return candidate_chars[n];
    return (ImWchar)-1;
}